

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

bstrList * bstrListCreate(void)

{
  bstring *pptVar1;
  bstrList *local_10;
  bstrList *sl;
  
  local_10 = (bstrList *)malloc(0x10);
  if (local_10 != (bstrList *)0x0) {
    pptVar1 = (bstring *)malloc(8);
    local_10->entry = pptVar1;
    if (local_10->entry == (bstring *)0x0) {
      free(local_10);
      local_10 = (bstrList *)0x0;
    }
    else {
      local_10->qty = 0;
      local_10->mlen = 1;
    }
  }
  return local_10;
}

Assistant:

struct bstrList * bstrListCreate (void) {
struct bstrList * sl =
	(struct bstrList *) bstr__alloc (sizeof (struct bstrList));
	if (sl) {
		sl->entry = (bstring *) bstr__alloc (1*sizeof (bstring));
		if (!sl->entry) {
			bstr__free (sl);
			sl = NULL;
		} else {
			sl->qty = 0;
			sl->mlen = 1;
		}
	}
	return sl;
}